

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

void __thiscall
booster::locale::gnu_gettext::converter<char>::converter
          (converter<char> *this,string *out_enc,string *in_enc)

{
  std::__cxx11::string::string((string *)this,(string *)out_enc);
  std::__cxx11::string::string((string *)&this->in_,(string *)in_enc);
  return;
}

Assistant:

converter(std::string out_enc,std::string in_enc) :
                    out_(out_enc),
                    in_(in_enc)
                {
                }